

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

void google::MaybeAppendWithLength(State *state,char *str,int length)

{
  ulong uVar1;
  
  if ((0 < length) && (state->append != false)) {
    if ((*str == '<') && ((state->out_begin < state->out_cur && (state->out_cur[-1] == '<')))) {
      if (state->out_cur + 1 < state->out_end) {
        *state->out_cur = ' ';
        state->out_cur = state->out_cur + 1;
      }
      else {
        state->overflowed = true;
      }
      if (state->overflowed == false) {
        *state->out_cur = '\0';
      }
    }
    if ((*str == 0x5f) || ((byte)((*str & 0xdfU) + 0xbf) < 0x1a)) {
      state->prev_name = state->out_cur;
      state->prev_name_length = length;
    }
    uVar1 = 0;
    do {
      if (state->out_end <= state->out_cur + 1) {
        state->overflowed = true;
        break;
      }
      *state->out_cur = str[uVar1];
      state->out_cur = state->out_cur + 1;
      uVar1 = uVar1 + 1;
    } while ((uint)length != uVar1);
    if (state->overflowed == false) {
      *state->out_cur = '\0';
    }
  }
  return;
}

Assistant:

static void MaybeAppendWithLength(State *state, const char * const str,
                                  const int length) {
  if (state->append && length > 0) {
    // Append a space if the output buffer ends with '<' and "str"
    // starts with '<' to avoid <<<.
    if (str[0] == '<' && state->out_begin < state->out_cur  &&
        state->out_cur[-1] == '<') {
      Append(state, " ", 1);
    }
    // Remember the last identifier name for ctors/dtors.
    if (IsAlpha(str[0]) || str[0] == '_') {
      state->prev_name = state->out_cur;
      state->prev_name_length = length;
    }
    Append(state, str, length);
  }
}